

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5IndexCharlen(char *pIn,int nIn)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  int local_1c;
  int local_18;
  int i;
  int nChar;
  int nIn_local;
  char *pIn_local;
  
  local_18 = 0;
  local_1c = 0;
  while (local_1c < nIn) {
    iVar2 = local_1c + 1;
    lVar1 = (long)local_1c;
    local_1c = iVar2;
    if (0xbf < (byte)pIn[lVar1]) {
      while( true ) {
        bVar3 = false;
        if (local_1c < nIn) {
          bVar3 = ((int)pIn[local_1c] & 0xc0U) == 0x80;
        }
        if (!bVar3) break;
        local_1c = local_1c + 1;
      }
    }
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

static int fts5IndexCharlen(const char *pIn, int nIn){
  int nChar = 0;            
  int i = 0;
  while( i<nIn ){
    if( (unsigned char)pIn[i++]>=0xc0 ){
      while( i<nIn && (pIn[i] & 0xc0)==0x80 ) i++;
    }
    nChar++;
  }
  return nChar;
}